

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void json::Json::nextRecord(Object *object,Node *RS)

{
  Nodes *this;
  Nodes *this_00;
  string *v;
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  JsonError *pJVar4;
  allocator<char> local_211;
  int64_t i;
  string name;
  stringstream s;
  
  this = &(RS->production).nodes;
  pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(this,0);
  this_00 = &(pvVar2->production).nodes;
  pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(this_00,0);
  pvVar3 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(this_00,2);
  std::__cxx11::string::string((string *)&name,(string *)&(pvVar2->token).value);
  pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at
                     (&(pvVar3->production).nodes,0);
  v = &(pvVar2->token).value;
  std::__cxx11::stringstream::stringstream((stringstream *)&s,(string *)v,_S_out|_S_in);
  if (pvVar2->isProduction_ == true) {
    iVar1 = (pvVar2->production).nonTerminal;
    if (iVar1 == 3) {
      createArray((Array *)&i,pvVar2);
      Object::add<json::Array,json::Array>(object,&name,(Array *)&i);
      Array::~Array((Array *)&i);
    }
    else {
      if (iVar1 != 2) {
        pJVar4 = (JsonError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"invalid token type",&local_211);
        JsonError::JsonError(pJVar4,(string *)&i);
        __cxa_throw(pJVar4,&JsonError::typeinfo,std::runtime_error::~runtime_error);
      }
      createObject((Object *)&i,pvVar2);
      Object::add<json::Object,json::Object>(object,&name,(Object *)&i);
      Object::~Object((Object *)&i);
    }
  }
  else {
    switch((pvVar2->token).tokenId) {
    case 6:
      i = 0;
      std::istream::_M_extract<long>((long *)&s);
      Object::operator()(object,&name,i);
      break;
    case 7:
      i = 0;
      std::istream::_M_extract<double>((double *)&s);
      Object::operator()(object,&name,(double)i);
      break;
    case 8:
      Object::add<json::String,std::__cxx11::string>(object,&name,v);
      break;
    case 9:
      i = i & 0xffffffffffffff00;
      std::istream::_M_extract<bool>((bool *)&s);
      Object::operator()(object,&name,i._0_1_);
      break;
    default:
      pJVar4 = (JsonError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"invalid token type",&local_211);
      JsonError::JsonError(pJVar4,(string *)&i);
      __cxa_throw(pJVar4,&JsonError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (1 < (ulong)(((long)(RS->production).nodes.
                         super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(RS->production).nodes.
                        super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60)) {
    pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(this,2);
    nextRecord(object,pvVar2);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

static void nextRecord(Object& object, parser::Node const& RS) {
            parser::Node const& R = RS.getProduction().nodes.at(0);

            parser::Node const& str = R.getProduction().nodes.at(0);
            parser::Node const& V = R.getProduction().nodes.at(2);

            std::string name = str.getToken().value;

            parser::Node const& uv = V.getProduction().nodes.at(0);

            std::stringstream s(uv.getToken().value);
            lexer::TokenId tokenType = uv.getToken().tokenId;

            if (uv.isProduction()) {
                if (uv.getProduction().nonTerminal == rules::Object) {
                    object(name, createObject(uv));
                } else if (uv.getProduction().nonTerminal == rules::Array) {
                    object(name, createArray(uv));
                } else {
                    throw JsonError("invalid token type");
                }
            } else {
                if (tokenType == rules::Integer) {
                    int64_t i = 0;
                    s >> i;
                    object(name, i);
                } else if (tokenType == rules::String) {
                    object(name, uv.getToken().value);
                } else if (tokenType == rules::Float) {
                    double d = 0;
                    s >> d;
                    object(name, d);
                } else if (tokenType == rules::Bool) {
                    bool b = false;
                    s >> b;
                    object(name, b);
                } else {
                    throw JsonError("invalid token type");
                }
            }

            if (RS.getProduction().nodes.size() > 1) {
                parser::Node const& nextRs = RS.getProduction().nodes.at(2);
                nextRecord(object, nextRs);
            }
        }